

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StableBlockVector.hpp
# Opt level: O3

void __thiscall
gmlc::containers::StableBlockVector<std::__cxx11::string,5u,std::allocator<std::__cxx11::string>>::
emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
          (StableBlockVector<std::__cxx11::string,5u,std::allocator<std::__cxx11::string>> *this,
          basic_string_view<char,_std::char_traits<char>_> *args)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  size_t sVar4;
  long *plVar5;
  long lVar6;
  
  StableBlockVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5U,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::blockCheck((StableBlockVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5U,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this);
  lVar2 = *(long *)(*(long *)(this + 8) + (long)*(int *)(this + 0x14) * 8);
  iVar1 = *(int *)(this + 0x18);
  *(int *)(this + 0x18) = iVar1 + 1;
  lVar6 = (long)iVar1 * 0x20;
  pcVar3 = args->_M_str;
  plVar5 = (long *)(lVar2 + lVar6);
  sVar4 = args->_M_len;
  *plVar5 = (long)(plVar5 + 2);
  std::__cxx11::string::_M_construct<char_const*>((string *)(lVar2 + lVar6),pcVar3,pcVar3 + sVar4);
  *(long *)this = *(long *)this + 1;
  return;
}

Assistant:

void emplace_back(Args&&... args)
        {
            blockCheck();
            new (&(dataptr[dataSlotIndex][bsize++]))
                X(std::forward<Args>(args)...);
            ++csize;
        }